

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_list_test.c
# Opt level: O1

int main(int argc,char **argv)

{
  uint uVar1;
  REF_STATUS RVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  bool bVar7;
  REF_LIST ref_list;
  REF_LIST original;
  REF_MPI ref_mpi;
  REF_LIST local_50;
  undefined8 local_48;
  ulong local_40;
  REF_MPI local_38;
  
  uVar1 = ref_mpi_start(argc,argv);
  if (uVar1 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c",
           0x20,"main",(ulong)uVar1,"start");
    return uVar1;
  }
  uVar1 = ref_mpi_create(&local_38);
  if (uVar1 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c",
           0x21,"main",(ulong)uVar1,"make mpi");
    return uVar1;
  }
  RVar2 = ref_list_free((REF_LIST)0x0);
  if (RVar2 != 2) {
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c",
           0x24,"main","dont free NULL",2,(long)RVar2);
    return 1;
  }
  uVar1 = ref_list_create(&local_50);
  if (uVar1 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c",
           0x25,"main",(ulong)uVar1,"create");
    return uVar1;
  }
  iVar5 = local_50->n;
  lVar6 = (long)iVar5;
  if (lVar6 != 0) {
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c",
           0x26,"main","init zero",0,lVar6);
  }
  uVar1 = (uint)(lVar6 != 0);
  if (iVar5 != 0) {
    return uVar1;
  }
  uVar3 = ref_list_free(local_50);
  if (uVar3 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c",
           0x27,"main",(ulong)uVar3,"free");
    return uVar3;
  }
  uVar3 = ref_list_create((REF_LIST *)&local_48);
  if (uVar3 == 0) {
    uVar3 = ref_list_deep_copy(&local_50,(REF_LIST)CONCAT44(local_48._4_4_,(int)local_48));
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c",
             0x2d,"main",(ulong)uVar3,"deep copy");
      goto LAB_00102448;
    }
    uVar3 = ref_list_free((REF_LIST)CONCAT44(local_48._4_4_,(int)local_48));
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c",
             0x2e,"main",(ulong)uVar3,"free");
      goto LAB_00102448;
    }
    uVar4 = ref_list_free(local_50);
    bVar7 = uVar4 == 0;
    uVar3 = uVar1;
    if (!bVar7) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c",
             0x2f,"main",(ulong)uVar4,"free");
      uVar3 = uVar4;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c",
           0x2c,"main",(ulong)uVar3,"create");
LAB_00102448:
    bVar7 = false;
  }
  if (!bVar7) {
    return uVar3;
  }
  uVar1 = ref_list_create(&local_50);
  if (uVar1 == 0) {
    uVar1 = ref_list_push(local_50,0x1b);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c",
             0x36,"main",(ulong)uVar1,"add");
      goto LAB_00102571;
    }
    iVar5 = local_50->n;
    uVar1 = uVar3;
    if ((long)iVar5 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c",
             0x37,"main","has one",1,(long)iVar5);
      uVar1 = 1;
    }
    if (iVar5 != 1) goto LAB_00102571;
    uVar3 = ref_list_free(local_50);
    bVar7 = uVar3 == 0;
    if (!bVar7) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c",
             0x38,"main",(ulong)uVar3,"free");
      uVar1 = uVar3;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c",
           0x34,"main",(ulong)uVar1,"create");
LAB_00102571:
    bVar7 = false;
  }
  if (!bVar7) {
    return uVar1;
  }
  uVar3 = ref_list_create(&local_50);
  if (uVar3 == 0) {
    RVar2 = ref_list_pop(local_50,(REF_INT *)&local_48);
    if (RVar2 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c",
             0x3f,"main","rm",1,(long)RVar2);
      uVar3 = 1;
      goto LAB_001026f5;
    }
    uVar3 = ref_list_push(local_50,0x1b);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c",
             0x42,"main",(ulong)uVar3,"add");
      goto LAB_001026f5;
    }
    uVar3 = ref_list_pop(local_50,(REF_INT *)&local_48);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c",
             0x43,"main",(ulong)uVar3,"rm");
      goto LAB_001026f5;
    }
    iVar5 = local_50->n;
    uVar3 = uVar1;
    if ((long)iVar5 != 0) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c",
             0x44,"main","has none",0,(long)iVar5);
      uVar3 = 1;
    }
    if (iVar5 != 0) goto LAB_001026f5;
    uVar1 = ref_list_free(local_50);
    bVar7 = uVar1 == 0;
    if (!bVar7) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c",
             0x46,"main",(ulong)uVar1,"free");
      uVar3 = uVar1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c",
           0x3d,"main",(ulong)uVar3,"create");
LAB_001026f5:
    bVar7 = false;
  }
  if (!bVar7) {
    return uVar3;
  }
  uVar1 = ref_list_create(&local_50);
  if (uVar1 == 0) {
    uVar4 = local_50->max;
    local_40 = (ulong)uVar4;
    if (-1 < (int)uVar4) {
      iVar5 = 0;
      do {
        uVar1 = ref_list_push(local_50,iVar5);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c"
                 ,0x4e,"main",(ulong)uVar1,"store");
          goto LAB_00102746;
        }
        iVar5 = iVar5 + 1;
      } while (uVar4 + 1 != iVar5);
    }
    if ((int)local_40 < local_50->max) {
      uVar4 = ref_list_free(local_50);
      bVar7 = uVar4 == 0;
      uVar1 = uVar3;
      if (!bVar7) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c"
               ,0x51,"main",(ulong)uVar4,"free");
        uVar1 = uVar4;
      }
    }
    else {
      bVar7 = false;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c",
             0x50,"main","more?");
      uVar1 = 1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c",
           0x4b,"main",(ulong)uVar1,"create");
LAB_00102746:
    bVar7 = false;
  }
  if (!bVar7) {
    return uVar1;
  }
  uVar3 = ref_list_create(&local_50);
  if (uVar3 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c",
           0x55,"main",(ulong)uVar3,"create");
    return uVar3;
  }
  uVar3 = ref_list_push(local_50,0x14);
  if (uVar3 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c",
           0x56,"main",(ulong)uVar3,"store");
    return uVar3;
  }
  uVar3 = ref_list_push(local_50,10);
  if (uVar3 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c",
           0x57,"main",(ulong)uVar3,"store");
    return uVar3;
  }
  uVar3 = ref_list_erase(local_50);
  if (uVar3 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c",
           0x59,"main",(ulong)uVar3,"rm -rf");
    return uVar3;
  }
  iVar5 = local_50->n;
  if ((long)iVar5 != 0) {
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c",
           0x5b,"main","has none",0,(long)iVar5);
    uVar1 = 1;
  }
  if (iVar5 != 0) {
    return uVar1;
  }
  uVar3 = ref_list_free(local_50);
  if (uVar3 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c",
           0x5d,"main",(ulong)uVar3,"free");
    return uVar3;
  }
  uVar3 = ref_list_create(&local_50);
  if (uVar3 == 0) {
    uVar3 = ref_list_push(local_50,0x1b);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c",
             0x65,"main",(ulong)uVar3,"add");
      goto LAB_00102abb;
    }
    uVar3 = ref_list_contains(local_50,0x1b,(REF_BOOL *)&local_48);
    iVar5 = (int)local_48;
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c",
             0x66,"main",(ulong)uVar3,"have");
      goto LAB_00102abb;
    }
    if ((long)(int)local_48 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c",
             0x67,"main","does have",1,(long)(int)local_48);
      uVar1 = 1;
    }
    uVar3 = uVar1;
    if (iVar5 != 1) goto LAB_00102abb;
    uVar3 = ref_list_contains(local_50,5,(REF_BOOL *)&local_48);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c",
             0x68,"main",(ulong)uVar3,"have");
      goto LAB_00102abb;
    }
    uVar3 = uVar1;
    if ((long)(int)local_48 != 0) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c",
             0x69,"main","does have",0,(long)(int)local_48);
      uVar3 = 1;
    }
    if ((int)local_48 != 0) goto LAB_00102abb;
    uVar1 = ref_list_free(local_50);
    bVar7 = uVar1 == 0;
    if (!bVar7) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c",
             0x6a,"main",(ulong)uVar1,"free");
      uVar3 = uVar1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c",99,
           "main",(ulong)uVar3,"create");
LAB_00102abb:
    bVar7 = false;
  }
  if (!bVar7) {
    return uVar3;
  }
  uVar1 = ref_list_create(&local_50);
  if (uVar1 == 0) {
    RVar2 = ref_list_delete(local_50,5);
    if (RVar2 == 5) {
      uVar1 = ref_list_push(local_50,0x15);
      if (uVar1 == 0) {
        uVar1 = ref_list_push(local_50,0x16);
        if (uVar1 == 0) {
          uVar1 = ref_list_push(local_50,0x17);
          if (uVar1 == 0) {
            iVar5 = local_50->n;
            if ((long)iVar5 != 3) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c"
                     ,0x7a,"main","has 3",3,(long)iVar5);
              uVar3 = 1;
            }
            uVar1 = uVar3;
            if (iVar5 == 3) {
              uVar1 = ref_list_delete(local_50,0x15);
              if (uVar1 == 0) {
                iVar5 = local_50->n;
                if ((long)iVar5 != 2) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c"
                         ,0x7e,"main","has 2",2,(long)iVar5);
                  uVar3 = 1;
                }
                uVar1 = uVar3;
                if (iVar5 == 2) {
                  uVar1 = ref_list_delete(local_50,0x17);
                  if (uVar1 == 0) {
                    iVar5 = local_50->n;
                    if ((long)iVar5 != 1) {
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c"
                             ,0x82,"main","has 1",1,(long)iVar5);
                      uVar3 = 1;
                    }
                    uVar1 = uVar3;
                    if (iVar5 == 1) {
                      uVar1 = ref_list_delete(local_50,0x16);
                      if (uVar1 == 0) {
                        iVar5 = local_50->n;
                        uVar1 = uVar3;
                        if ((long)iVar5 != 0) {
                          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c"
                                 ,0x86,"main","has 0",0,(long)iVar5);
                          uVar1 = 1;
                        }
                        if (iVar5 == 0) {
                          uVar3 = ref_list_free(local_50);
                          bVar7 = uVar3 == 0;
                          if (!bVar7) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c"
                                   ,0x88,"main",(ulong)uVar3,"free");
                            uVar1 = uVar3;
                          }
                          goto LAB_00102e57;
                        }
                      }
                      else {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c"
                               ,0x85,"main",(ulong)uVar1,"have");
                      }
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c"
                           ,0x81,"main",(ulong)uVar1,"have");
                  }
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c"
                       ,0x7d,"main",(ulong)uVar1,"have");
              }
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c"
                   ,0x79,"main",(ulong)uVar1,"add");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c"
                 ,0x77,"main",(ulong)uVar1,"add");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c"
               ,0x75,"main",(ulong)uVar1,"add");
      }
    }
    else {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c",
             0x72,"main","rm",5,(long)RVar2);
      uVar1 = 1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c",
           0x6f,"main",(ulong)uVar1,"create");
  }
  bVar7 = false;
LAB_00102e57:
  if (bVar7) {
    uVar1 = ref_mpi_free(local_38);
    if (uVar1 == 0) {
      uVar1 = ref_mpi_stop();
      if (uVar1 == 0) {
        uVar1 = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c"
               ,0x8c,"main",(ulong)uVar1,"stop");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c",
             0x8b,"main",(ulong)uVar1,"mpi free");
    }
  }
  return uVar1;
}

Assistant:

int main(int argc, char *argv[]) {
  REF_LIST ref_list;
  REF_MPI ref_mpi;
  RSS(ref_mpi_start(argc, argv), "start");
  RSS(ref_mpi_create(&ref_mpi), "make mpi");

  {
    REIS(REF_NULL, ref_list_free(NULL), "dont free NULL");
    RSS(ref_list_create(&ref_list), "create");
    REIS(0, ref_list_n(ref_list), "init zero");
    RSS(ref_list_free(ref_list), "free");
  }

  { /* deep copy empty */
    REF_LIST original;
    RSS(ref_list_create(&original), "create");
    RSS(ref_list_deep_copy(&ref_list, original), "deep copy");
    RSS(ref_list_free(original), "free");
    RSS(ref_list_free(ref_list), "free");
  }

  { /* store one */
    REF_INT item;
    RSS(ref_list_create(&ref_list), "create");
    item = 27;
    RSS(ref_list_push(ref_list, item), "add");
    REIS(1, ref_list_n(ref_list), "has one");
    RSS(ref_list_free(ref_list), "free");
  }

  { /* remove */
    REF_INT item, last;
    RSS(ref_list_create(&ref_list), "create");

    REIS(REF_FAILURE, ref_list_pop(ref_list, &last), "rm");

    item = 27;
    RSS(ref_list_push(ref_list, item), "add");
    RSS(ref_list_pop(ref_list, &last), "rm");
    REIS(0, ref_list_n(ref_list), "has none");

    RSS(ref_list_free(ref_list), "free");
  }

  { /* store lots */
    REF_INT item, max;
    RSS(ref_list_create(&ref_list), "create");
    max = ref_list_max(ref_list);
    for (item = 0; item <= max; item++) {
      RSS(ref_list_push(ref_list, item), "store");
    }
    RAS(ref_list_max(ref_list) > max, "more?");
    RSS(ref_list_free(ref_list), "free");
  }

  { /* erase */
    RSS(ref_list_create(&ref_list), "create");
    RSS(ref_list_push(ref_list, 20), "store");
    RSS(ref_list_push(ref_list, 10), "store");

    RSS(ref_list_erase(ref_list), "rm -rf");

    REIS(0, ref_list_n(ref_list), "has none");

    RSS(ref_list_free(ref_list), "free");
  }

  { /* contains */
    REF_INT item;
    REF_BOOL contains;
    RSS(ref_list_create(&ref_list), "create");
    item = 27;
    RSS(ref_list_push(ref_list, item), "add");
    RSS(ref_list_contains(ref_list, item, &contains), "have");
    REIS(REF_TRUE, contains, "does have");
    RSS(ref_list_contains(ref_list, 5, &contains), "have");
    REIS(REF_FALSE, contains, "does have");
    RSS(ref_list_free(ref_list), "free");
  }

  { /* delete first */
    REF_INT item;
    RSS(ref_list_create(&ref_list), "create");

    item = 5;
    REIS(REF_NOT_FOUND, ref_list_delete(ref_list, item), "rm");

    item = 21;
    RSS(ref_list_push(ref_list, item), "add");
    item = 22;
    RSS(ref_list_push(ref_list, item), "add");
    item = 23;
    RSS(ref_list_push(ref_list, item), "add");
    REIS(3, ref_list_n(ref_list), "has 3");

    item = 21;
    RSS(ref_list_delete(ref_list, item), "have");
    REIS(2, ref_list_n(ref_list), "has 2");

    item = 23;
    RSS(ref_list_delete(ref_list, item), "have");
    REIS(1, ref_list_n(ref_list), "has 1");

    item = 22;
    RSS(ref_list_delete(ref_list, item), "have");
    REIS(0, ref_list_n(ref_list), "has 0");

    RSS(ref_list_free(ref_list), "free");
  }

  RSS(ref_mpi_free(ref_mpi), "mpi free");
  RSS(ref_mpi_stop(), "stop");

  return 0;
}